

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Attribute * attrsLookup(TidyDocImpl *doc,TidyAttribImpl *attribs,ctmbstr atnam)

{
  uint uVar1;
  int iVar2;
  Attribute *pAVar3;
  bool bVar4;
  AttrHash *local_38;
  AttrHash *p;
  Attribute *np;
  ctmbstr atnam_local;
  TidyAttribImpl *attribs_local;
  TidyDocImpl *doc_local;
  
  if (atnam == (ctmbstr)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    uVar1 = attrsHash(atnam);
    local_38 = attribs->hashtab[uVar1];
    while( true ) {
      bVar4 = false;
      if (local_38 != (AttrHash *)0x0) {
        bVar4 = local_38->attr != (Attribute *)0x0;
      }
      if (!bVar4) {
        p = (AttrHash *)attribute_defs;
        while( true ) {
          bVar4 = false;
          if (p != (AttrHash *)0x0) {
            bVar4 = p->next != (_AttrHash *)0x0;
          }
          if (!bVar4) break;
          iVar2 = prvTidytmbstrcasecmp(atnam,(ctmbstr)p->next);
          if (iVar2 == 0) {
            pAVar3 = attrsInstall(doc,attribs,(Attribute *)p);
            return pAVar3;
          }
          p = p + 2;
        }
        return (Attribute *)0x0;
      }
      iVar2 = prvTidytmbstrcasecmp(atnam,local_38->attr->name);
      if (iVar2 == 0) break;
      local_38 = local_38->next;
    }
    doc_local = (TidyDocImpl *)local_38->attr;
  }
  return (Attribute *)doc_local;
}

Assistant:

static const Attribute* attrsLookup(TidyDocImpl* doc,
                               TidyAttribImpl* ARG_UNUSED(attribs),
                               ctmbstr atnam)
{
    const Attribute *np;
    const AttrHash *p;

    if (!atnam)
        return NULL;

    for (p = attribs->hashtab[attrsHash(atnam)]; p && p->attr; p = p->next)
        if (TY_(tmbstrcasecmp)(atnam, p->attr->name) == 0)
            return p->attr;

    for (np = attribute_defs; np && np->name; ++np)
        if (TY_(tmbstrcasecmp)(atnam, np->name) == 0)
            return attrsInstall(doc, attribs, np);

    return NULL;
}